

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O1

JSON_Status json_object_remove_internal(JSON_Object *object,char *name,parson_bool_t free_value)

{
  size_t *psVar1;
  size_t sVar2;
  size_t key_len;
  ulong uVar3;
  size_t sVar4;
  ulong uVar5;
  unsigned_long hash;
  ulong uVar6;
  size_t sVar7;
  JSON_Status JVar8;
  parson_bool_t found;
  parson_bool_t local_2c;
  
  local_2c = 0;
  JVar8 = -1;
  if (object != (JSON_Object *)0x0) {
    key_len = strlen(name);
    if (key_len == 0) {
      hash = 0x1505;
    }
    else {
      hash = 0x1505;
      sVar4 = 0;
      do {
        if ((ulong)(byte)name[sVar4] == 0) break;
        hash = hash * 0x21 + (ulong)(byte)name[sVar4];
        sVar4 = sVar4 + 1;
      } while (key_len != sVar4);
    }
    local_2c = 0;
    uVar3 = json_object_get_cell_ix(object,name,key_len,hash,&local_2c);
    if (local_2c != 0) {
      uVar6 = object->cells[uVar3];
      if (free_value != 0) {
        json_value_free(object->values[uVar6]);
      }
      (*parson_free)(object->names[uVar6]);
      sVar7 = object->count;
      if (uVar6 < sVar7 - 1) {
        object->names[uVar6] = object->names[sVar7 - 1];
        object->values[uVar6] = object->values[sVar7 - 1];
        psVar1 = object->cell_ixs;
        psVar1[uVar6] = psVar1[sVar7 - 1];
        object->hashes[uVar6] = object->hashes[sVar7 - 1];
        object->cells[psVar1[uVar6]] = uVar6;
      }
      object->count = object->count - 1;
      uVar6 = object->cell_capacity - 1;
      if (uVar6 != 0) {
        psVar1 = object->cells;
        uVar5 = 0;
        sVar7 = uVar3;
        do {
          sVar7 = sVar7 + 1 & uVar6;
          sVar2 = psVar1[sVar7];
          if (sVar2 == 0xffffffffffffffff) break;
          uVar6 = uVar6 & object->hashes[sVar2];
          if (((uVar3 < sVar7) && ((uVar6 <= uVar3 || (sVar7 < uVar6)))) ||
             ((sVar7 < uVar3 && ((uVar6 <= uVar3 && (sVar7 < uVar6)))))) {
            object->cell_ixs[sVar2] = uVar3;
            psVar1[uVar3] = psVar1[sVar7];
            uVar3 = sVar7;
          }
          uVar5 = uVar5 + 1;
          uVar6 = object->cell_capacity - 1;
        } while (uVar5 < uVar6);
      }
      object->cells[uVar3] = 0xffffffffffffffff;
      JVar8 = 0;
    }
  }
  return JVar8;
}

Assistant:

static JSON_Status json_object_remove_internal(JSON_Object *object, const char *name, parson_bool_t free_value) {
    unsigned long hash = 0;
    parson_bool_t found = PARSON_FALSE;
    size_t cell = 0;
    size_t item_ix = 0;
    size_t last_item_ix = 0;
    size_t i = 0;
    size_t j = 0;
    size_t x = 0;
    size_t k = 0;
    JSON_Value *val = NULL;

    if (object == NULL) {
        return JSONFailure;
    }

    hash = hash_string(name, strlen(name));
    found = PARSON_FALSE;
    cell = json_object_get_cell_ix(object, name, strlen(name), hash, &found);
    if (!found) {
        return JSONFailure;
    }

    item_ix = object->cells[cell];
    if (free_value) {
        val = object->values[item_ix];
        json_value_free(val);
        val = NULL;
    }

    parson_free(object->names[item_ix]);
    last_item_ix = object->count - 1;
    if (item_ix < last_item_ix) {
        object->names[item_ix] = object->names[last_item_ix];
        object->values[item_ix] = object->values[last_item_ix];
        object->cell_ixs[item_ix] = object->cell_ixs[last_item_ix];
        object->hashes[item_ix] = object->hashes[last_item_ix];
        object->cells[object->cell_ixs[item_ix]] = item_ix;
    }
    object->count--;

    i = cell;
    j = i;
    for (x = 0; x < (object->cell_capacity - 1); x++) {
        j = (j + 1) & (object->cell_capacity - 1);
        if (object->cells[j] == OBJECT_INVALID_IX) {
            break;
        }
        k = object->hashes[object->cells[j]] & (object->cell_capacity - 1);
        if ((j > i && (k <= i || k > j))
         || (j < i && (k <= i && k > j))) {
            object->cell_ixs[object->cells[j]] = i;
            object->cells[i] = object->cells[j];
            i = j;
        }
    }
    object->cells[i] = OBJECT_INVALID_IX;
    return JSONSuccess;
}